

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O3

void * debug_lock_alloc(uint locktype)

{
  undefined4 *ptr;
  void *pvVar1;
  
  ptr = (undefined4 *)event_mm_malloc_(0x20);
  if (ptr == (undefined4 *)0x0) {
LAB_002d2775:
    ptr = (undefined4 *)0x0;
  }
  else {
    if (original_lock_fns_.alloc == (_func_void_ptr_uint *)0x0) {
      *(undefined8 *)(ptr + 6) = 0;
    }
    else {
      pvVar1 = (*original_lock_fns_.alloc)(locktype | 1);
      *(void **)(ptr + 6) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        event_mm_free_(ptr);
        goto LAB_002d2775;
      }
    }
    *ptr = 0xdeb0b10c;
    ptr[1] = locktype;
    ptr[4] = 0;
    *(undefined8 *)(ptr + 2) = 0;
  }
  return ptr;
}

Assistant:

static void *
debug_lock_alloc(unsigned locktype)
{
	struct debug_lock *result = mm_malloc(sizeof(struct debug_lock));
	if (!result)
		return NULL;
	if (original_lock_fns_.alloc) {
		if (!(result->lock = original_lock_fns_.alloc(
				locktype|EVTHREAD_LOCKTYPE_RECURSIVE))) {
			mm_free(result);
			return NULL;
		}
	} else {
		result->lock = NULL;
	}
	result->signature = DEBUG_LOCK_SIG;
	result->locktype = locktype;
	result->count = 0;
	result->held_by = 0;
	return result;
}